

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O0

void aom_highbd_dc_left_predictor_4x8_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  undefined8 uVar1;
  uint16_t *in_RCX;
  ptrdiff_t in_RSI;
  uint16_t *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  __m128i dc;
  __m128i four;
  __m128i sum;
  ushort local_b8;
  ushort uStack_b6;
  ushort uStack_b4;
  ushort uStack_b2;
  ushort uStack_b0;
  ushort uStack_ae;
  ushort uStack_ac;
  ushort uStack_aa;
  undefined8 local_a8;
  undefined8 uStack_a0;
  ptrdiff_t local_68;
  uint16_t *local_60;
  undefined1 local_58 [16];
  undefined4 local_40;
  undefined4 local_3c;
  ushort local_38;
  ushort uStack_36;
  ushort uStack_34;
  ushort uStack_32;
  ushort uStack_30;
  ushort uStack_2e;
  ushort uStack_2c;
  ushort uStack_2a;
  undefined8 local_28;
  undefined8 uStack_20;
  short local_18;
  ushort uStack_16;
  ushort uStack_14;
  ushort uStack_12;
  ushort uStack_10;
  ushort uStack_e;
  ushort uStack_c;
  ushort uStack_a;
  
  local_68 = in_RSI;
  local_60 = in_RDI;
  dc_sum_8(in_RCX);
  local_40 = 4;
  local_58 = ZEXT416(4);
  local_a8 = local_58._0_8_;
  uStack_a0 = 0;
  local_28 = local_58._0_8_;
  uVar1 = local_28;
  uStack_20 = 0;
  local_18 = (short)extraout_XMM0_Qa;
  uStack_16 = (ushort)((ulong)extraout_XMM0_Qa >> 0x10);
  uStack_14 = (ushort)((ulong)extraout_XMM0_Qa >> 0x20);
  uStack_12 = (ushort)((ulong)extraout_XMM0_Qa >> 0x30);
  uStack_10 = (ushort)extraout_XMM0_Qb;
  uStack_e = (ushort)((ulong)extraout_XMM0_Qb >> 0x10);
  uStack_c = (ushort)((ulong)extraout_XMM0_Qb >> 0x20);
  uStack_a = (ushort)((ulong)extraout_XMM0_Qb >> 0x30);
  local_28._0_2_ = local_58._0_2_;
  local_38 = local_18 + (short)local_28;
  uStack_36 = uStack_16;
  uStack_34 = uStack_14;
  uStack_32 = uStack_12;
  uStack_30 = uStack_10;
  uStack_2e = uStack_e;
  uStack_2c = uStack_c;
  uStack_2a = uStack_a;
  local_3c = 3;
  local_b8 = local_38 >> 3;
  uStack_b6 = uStack_16 >> 3;
  uStack_b4 = uStack_14 >> 3;
  uStack_b2 = uStack_12 >> 3;
  uStack_b0 = uStack_10 >> 3;
  uStack_ae = uStack_e >> 3;
  uStack_ac = uStack_c >> 3;
  uStack_aa = uStack_a >> 3;
  local_28 = uVar1;
  dc_store_4x8(local_60,local_68,(__m128i *)&local_b8);
  return;
}

Assistant:

void aom_highbd_dc_left_predictor_4x8_sse2(uint16_t *dst, ptrdiff_t stride,
                                           const uint16_t *above,
                                           const uint16_t *left, int bd) {
  const __m128i sum = dc_sum_8(left);
  const __m128i four = _mm_cvtsi32_si128(4);
  const __m128i dc = _mm_srli_epi16(_mm_add_epi16(sum, four), 3);
  (void)above;
  (void)bd;
  dc_store_4x8(dst, stride, &dc);
}